

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallImportedRuntimeArtifactsGenerator.cxx
# Opt level: O2

string * __thiscall
cmInstallImportedRuntimeArtifactsGenerator::GetDestination
          (string *__return_storage_ptr__,cmInstallImportedRuntimeArtifactsGenerator *this,
          string *config)

{
  cmLocalGenerator *lg;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string
            ((string *)&local_38,(string *)&(this->super_cmInstallGenerator).Destination);
  lg = cmGeneratorTarget::GetLocalGenerator(this->Target);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  cmGeneratorExpression::Evaluate
            (__return_storage_ptr__,&local_38,lg,config,(cmGeneratorTarget *)0x0,
             (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallImportedRuntimeArtifactsGenerator::GetDestination(
  std::string const& config) const
{
  return cmGeneratorExpression::Evaluate(
    this->Destination, this->Target->GetLocalGenerator(), config);
}